

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtobj.cpp
# Opt level: O0

void CVmObjTads::set_sc_cb(vm_obj_id_t obj,void *ctx0)

{
  int iVar1;
  CVmObject *this;
  vm_tadsobj_hdr *this_00;
  vm_obj_id_t *in_RSI;
  tadsobj_objid_and_ptr *path;
  vm_tadsobj_hdr *hdr;
  set_sc_cb_ctx *ctx;
  tadsobj_objid_and_ptr *local_28;
  
  iVar1 = is_tadsobj_obj(0);
  if (iVar1 != 0) {
    this = vm_objp(0);
    this_00 = get_hdr((CVmObjTads *)this);
    local_28 = this_00->inh_path;
    if (local_28 != (tadsobj_objid_and_ptr *)0x0) {
      for (; local_28->id != 0; local_28 = local_28 + 1) {
        if (local_28->id == *in_RSI) {
          vm_tadsobj_hdr::inval_inh_path(this_00);
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void CVmObjTads::set_sc_cb(VMG_ vm_obj_id_t obj, void *ctx0)
{
    /* if this is a TadsObject instance, update it */
    if (CVmObjTads::is_tadsobj_obj(vmg_ obj))
    {
        /* cast the context to our private structure */
        set_sc_cb_ctx *ctx = (set_sc_cb_ctx *)ctx0;

        /* get this object's header */
        vm_tadsobj_hdr *hdr = ((CVmObjTads *)vm_objp(vmg_ obj))->get_hdr();
        
        /* 
         *   if it has a cached inheritance path, check to see if it contains
         *   the object being changed 
         */
        tadsobj_objid_and_ptr *path = hdr->inh_path;
        if (path != 0)
        {
            /* scan the path for 'obj' */
            for ( ; path->id != VM_INVALID_OBJ ; ++path)
            {
                /* if this superclass is 'obj', we must delete the path */
                if (path->id == ctx->obj)
                {
                    /* we need to drop this path */
                    hdr->inval_inh_path();
                    
                    /* no need to look any further */
                    break;
                }
            }
        }
    }